

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O3

uint8_t * svb_decode_avx_simple(uint32_t *out,uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count)

{
  byte bVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  byte bVar6;
  uint8_t *puVar5;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (0x1f < count) {
    uVar7 = *(ulong *)keyPtr;
    if (count >> 5 != 1) {
      uVar9 = 1;
      uVar10 = uVar7;
      do {
        uVar7 = *(ulong *)(keyPtr + uVar9 * 8);
        uVar9 = uVar9 + 1;
        uVar11 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                        [uVar10 & 0xff];
        auVar2 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                             *(undefined1 (*) [16])
                              (shuffleTable[0] + (uint)((int)(uVar10 & 0xff) << 4)));
        *(undefined1 (*) [16])out = auVar2;
        bVar6 = (byte)(uVar10 >> 8);
        bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [bVar6];
        auVar2 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar11),
                             (undefined1  [16])shuffleTable[bVar6]);
        lVar3 = bVar1 + uVar11;
        *(undefined1 (*) [16])((long)out + 0x10) = auVar2;
        uVar8 = (uint)uVar10 >> 0x10 & 0xff;
        bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [uVar8];
        auVar2 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + bVar1 + uVar11),
                             *(undefined1 (*) [16])(shuffleTable[0] + (uVar8 << 4)));
        lVar4 = (ulong)bVar6 + lVar3;
        *(undefined1 (*) [16])((long)out + 0x20) = auVar2;
        uVar11 = uVar10 >> 0x18 & 0xff;
        bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [uVar11];
        auVar2 = vpshufb_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                             *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
        lVar3 = (ulong)bVar1 + lVar4;
        *(undefined1 (*) [16])((long)out + 0x30) = auVar2;
        uVar11 = uVar10 >> 0x20 & 0xff;
        bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [uVar11];
        auVar2 = vpshufb_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar4),
                             *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
        lVar4 = (ulong)bVar6 + lVar3;
        *(undefined1 (*) [16])((long)out + 0x40) = auVar2;
        uVar11 = uVar10 >> 0x28 & 0xff;
        bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [uVar11];
        auVar2 = vpshufb_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                             *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
        uVar11 = uVar10 >> 0x30 & 0xff;
        lVar3 = (ulong)bVar1 + lVar4;
        *(undefined1 (*) [16])((long)out + 0x50) = auVar2;
        bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [uVar11];
        auVar2 = vpshufb_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar4),
                             *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
        *(undefined1 (*) [16])((long)out + 0x60) = auVar2;
        auVar2 = vpshufb_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                             (undefined1  [16])shuffleTable[uVar10 >> 0x38]);
        dataPtr = *(undefined1 (*) [16])dataPtr +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar10 >> 0x38] + (ulong)bVar6 + lVar3;
        *(undefined1 (*) [16])((long)out + 0x70) = auVar2;
        out = (uint32_t *)((long)out + 0x80);
        uVar10 = uVar7;
      } while (count >> 5 != uVar9);
    }
    bVar6 = (byte)(uVar7 >> 8);
    uVar10 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                    [uVar7 & 0xff];
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                         *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)(uVar7 & 0xff) << 4)))
    ;
    *(undefined1 (*) [16])out = auVar2;
    bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [bVar6];
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar10),
                         (undefined1  [16])shuffleTable[bVar6]);
    uVar8 = (uint)uVar7 >> 0x10 & 0xff;
    lVar3 = bVar1 + uVar10;
    *(undefined1 (*) [16])((long)out + 0x10) = auVar2;
    bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [uVar8];
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + bVar1 + uVar10),
                         *(undefined1 (*) [16])(shuffleTable[0] + (uVar8 << 4)));
    uVar10 = uVar7 >> 0x18 & 0xff;
    lVar4 = (ulong)bVar6 + lVar3;
    *(undefined1 (*) [16])((long)out + 0x20) = auVar2;
    bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [uVar10];
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])
                          (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                         *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
    uVar10 = uVar7 >> 0x20 & 0xff;
    lVar3 = (ulong)bVar1 + lVar4;
    *(undefined1 (*) [16])((long)out + 0x30) = auVar2;
    bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [uVar10];
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])
                          (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar4),
                         *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
    uVar10 = uVar7 >> 0x28 & 0xff;
    lVar4 = (ulong)bVar6 + lVar3;
    *(undefined1 (*) [16])((long)out + 0x40) = auVar2;
    bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [uVar10];
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])
                          (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                         *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
    uVar10 = uVar7 >> 0x30 & 0xff;
    lVar3 = (ulong)bVar1 + lVar4;
    *(undefined1 (*) [16])((long)out + 0x50) = auVar2;
    bVar6 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
            [uVar10];
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])
                          (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar4),
                         *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
    *(undefined1 (*) [16])((long)out + 0x60) = auVar2;
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])
                          (*(undefined1 (*) [16])dataPtr + (ulong)bVar6 + lVar3),
                         (undefined1  [16])shuffleTable[uVar7 >> 0x38]);
    dataPtr = *(undefined1 (*) [16])dataPtr +
              (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar7 >> 0x38] + (ulong)bVar6 + lVar3;
    *(undefined1 (*) [16])((long)out + 0x70) = auVar2;
    out = (uint32_t *)((long)out + 0x80);
  }
  puVar5 = svb_decode_scalar(out,keyPtr + (count >> 5) * 8,dataPtr,(uint)count & 0x1f);
  return puVar5;
}

Assistant:

uint8_t *svb_decode_avx_simple(uint32_t *out, uint8_t *__restrict__ keyPtr,
                               uint8_t *__restrict__ dataPtr, uint64_t count) {

  uint64_t keybytes = count / 4; // number of key bytes
  xmm_t Data;
  if (keybytes >= 8) {

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];

      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 4, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 8, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 12, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 16, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 20, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 24, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 28, Data);

      out += 32;
    }
    {
      uint64_t keys = nextkeys;

      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 4, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 8, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 12, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 16, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 20, Data);

      keys >>= 16;
      Data = _decode_avx((keys & 0xFF), &dataPtr);
      _write_avx(out + 24, Data);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      _write_avx(out + 28, Data);

      out += 32;
    }
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  return svb_decode_scalar(out, keyPtr + consumedkeys, dataPtr, count & 31);
}